

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoryDecoder.h
# Opt level: O0

StandardVariable *
KDIS::DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::StandardVariable>::FactoryDecode
          (KINT32 EnumVal,KDataStream *stream)

{
  bool bVar1;
  pointer ppVar2;
  FactoryDecoder<KDIS::DATA_TYPE::StandardVariable> *pFVar3;
  _Self local_30;
  _Self local_28;
  iterator itr;
  KDataStream *stream_local;
  StandardVariable *pSStack_10;
  KINT32 EnumVal_local;
  
  itr._M_node = (_Base_ptr)stream;
  stream_local._4_4_ = EnumVal;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FactoryDecoder<KDIS::DATA_TYPE::StandardVariable>_>,_std::less<int>,_std::allocator<std::pair<const_int,_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FactoryDecoder<KDIS::DATA_TYPE::StandardVariable>_>_>_>_>
       ::find((map<int,_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FactoryDecoder<KDIS::DATA_TYPE::StandardVariable>_>,_std::less<int>,_std::allocator<std::pair<const_int,_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FactoryDecoder<KDIS::DATA_TYPE::StandardVariable>_>_>_>_>
               *)m_mDecoders,(key_type *)((long)&stream_local + 4));
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FactoryDecoder<KDIS::DATA_TYPE::StandardVariable>_>,_std::less<int>,_std::allocator<std::pair<const_int,_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FactoryDecoder<KDIS::DATA_TYPE::StandardVariable>_>_>_>_>
       ::end((map<int,_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FactoryDecoder<KDIS::DATA_TYPE::StandardVariable>_>,_std::less<int>,_std::allocator<std::pair<const_int,_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FactoryDecoder<KDIS::DATA_TYPE::StandardVariable>_>_>_>_>
              *)m_mDecoders);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_int,_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FactoryDecoder<KDIS::DATA_TYPE::StandardVariable>_>_>_>
             ::operator->(&local_28);
    pFVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::FactoryDecoder<KDIS::DATA_TYPE::StandardVariable>_>::
             operator->(&ppVar2->second);
    pSStack_10 = (StandardVariable *)
                 (**(code **)(*(long *)pFVar3 + 0x10))(pFVar3,stream_local._4_4_,itr._M_node);
  }
  else {
    pSStack_10 = (StandardVariable *)0x0;
  }
  return pSStack_10;
}

Assistant:

static DecoderBaseTyp *FactoryDecode(KINT32 EnumVal, KDataStream &stream) noexcept(false)
	{
		// Try to find a decoder
		typename std::map<KINT32, FacDecPtr>::iterator itr = m_mDecoders.find( EnumVal );
		if( itr != m_mDecoders.end() )
		{
			return itr->second->FactoryDecode( EnumVal, stream );
		}
		
		// No decoders found so return NULL.
		return 0;
	}